

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,optional<Network> network)

{
  AddrInfo *this_00;
  FastRandomContext *this_01;
  long lVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Network NVar6;
  long lVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  uint64_t uVar10;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  Logger *pLVar11;
  int range;
  long lVar12;
  char **in_R8;
  int iVar13;
  long in_FS_OFFSET;
  double dVar14;
  undefined1 auVar15 [16];
  string_view str;
  string_view logging_function;
  double local_138;
  undefined1 local_110 [8];
  int node_id;
  optional<Network> network_local;
  string local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  network_local.super__Optional_base<Network,_true,_true>._M_payload.
  super__Optional_payload_base<Network> =
       network.super__Optional_base<Network,_true,_true>._M_payload.
       super__Optional_payload_base<Network>;
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
                (__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    goto LAB_003a1473;
  }
  if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
    lVar12 = (long)this->nNew;
    lVar7 = (long)this->nTried;
LAB_003a0fdd:
    if (((!new_only) || (lVar12 != 0)) && (lVar12 + lVar7 != 0)) {
      if (lVar12 != 0 && (!new_only && lVar7 != 0)) {
        bVar3 = RandomMixin<FastRandomContext>::randbool
                          (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
      }
      else {
        bVar3 = !new_only && lVar7 != 0;
      }
      range = 0x400;
      if (bVar3 != false) {
        range = 0x100;
      }
      this_01 = &this->insecure_rand;
      local_138 = 1.0;
      do {
        iVar4 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this_01->super_RandomMixin<FastRandomContext>,range);
        iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this_01->super_RandomMixin<FastRandomContext>,0x40);
        for (iVar13 = 0; iVar13 != 0x40; iVar13 = iVar13 + 1) {
          node_id = GetEntry(this,bVar3,(long)iVar4,(long)((iVar5 + iVar13) % 0x40));
          if (node_id != -1) {
            if (network_local.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network>._M_engaged != true) {
LAB_003a10df:
              cVar9 = std::
                      _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&(this->mapInfo)._M_h,&node_id);
              if (cVar9.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur ==
                  (__node_type *)0x0) {
                __assert_fail("it_found != mapInfo.end()",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                              ,0x307,
                              "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, std::optional<Network>) const"
                             );
              }
              this_00 = (AddrInfo *)
                        ((long)cVar9.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x10);
              uVar10 = RandomMixin<FastRandomContext>::randbits<30>
                                 (&this_01->super_RandomMixin<FastRandomContext>);
              auVar15._8_4_ = (int)(uVar10 >> 0x20);
              auVar15._0_8_ = uVar10;
              auVar15._12_4_ = 0x45300000;
              now = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                              ();
              dVar14 = AddrInfo::GetChance(this_00,(NodeSeconds)now.__d.__r);
              if ((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0) <
                  dVar14 * local_138 * 1073741824.0) {
                bVar2 = ::LogAcceptCategory(ADDRMAN,SUB84(now.__d.__r,0));
                if (bVar2) {
                  CService::ToStringAddrPort_abi_cxx11_(local_f8,(CService *)this_00);
                  local_110 = (undefined1  [8])0x6dc68d;
                  if (bVar3 != false) {
                    local_110 = (undefined1  [8])0x6cda16;
                  }
                  pLVar11 = LogInstance();
                  bVar3 = BCLog::Logger::Enabled(pLVar11);
                  if (bVar3) {
                    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
                    log_msg._M_string_length = 0;
                    log_msg.field_2._M_local_buf[0] = '\0';
                    tinyformat::format<std::__cxx11::string,char_const*>
                              (&local_78,(tinyformat *)"Selected %s from %s\n",(char *)local_f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110,in_R8);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&log_msg,&local_78);
                    std::__cxx11::string::~string((string *)&local_78);
                    pLVar11 = LogInstance();
                    local_78._M_dataplus._M_p = (pointer)0x54;
                    local_78._M_string_length = 0x6df298;
                    source_file._M_str =
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                    ;
                    source_file._M_len = 0x54;
                    str._M_str = log_msg._M_dataplus._M_p;
                    str._M_len = log_msg._M_string_length;
                    logging_function._M_str = "Select_";
                    logging_function._M_len = 7;
                    BCLog::Logger::LogPrintStr
                              (pLVar11,str,logging_function,source_file,0x30c,ADDRMAN,Debug);
                    std::__cxx11::string::~string((string *)&log_msg);
                  }
                  std::__cxx11::string::~string((string *)local_f8);
                }
                std::
                pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                ::pair<const_AddrInfo_&,_true>
                          (__return_storage_ptr__,this_00,
                           (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                            *)((long)cVar9.
                                     super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                     ._M_cur + 0x48));
                goto LAB_003a12a4;
              }
              local_138 = local_138 * 1.2;
              break;
            }
            cVar9 = std::
                    _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&(this->mapInfo)._M_h,&node_id);
            if (cVar9.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur !=
                (__node_type *)0x0) {
              NVar6 = CNetAddr::GetNetwork
                                ((CNetAddr *)
                                 ((long)cVar9.
                                        super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                        ._M_cur + 0x10));
              if (NVar6 == network_local.super__Optional_base<Network,_true,_true>._M_payload.
                           super__Optional_payload_base<Network>._M_payload._M_value)
              goto LAB_003a10df;
            }
          }
        }
      } while( true );
    }
  }
  else {
    cVar8 = std::
            _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_network_counts)._M_h,(key_type *)&network_local);
    if (cVar8.super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar12 = *(long *)((long)cVar8.
                               super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                               ._M_cur + 0x10);
      lVar7 = *(long *)((long)cVar8.
                              super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                              ._M_cur + 0x18);
      goto LAB_003a0fdd;
    }
  }
  std::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
            (__return_storage_ptr__);
LAB_003a12a4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_003a1473:
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, std::optional<Network> network) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (network.has_value()) {
        auto it = m_network_counts.find(*network);
        if (it == m_network_counts.end()) return {};

        auto counts = it->second;
        new_count = counts.n_new;
        tried_count = counts.n_tried;
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position, node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (network.has_value()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && it->second.GetNetwork() == *network) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}